

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool setFontKerningFromValue(Value *value,QFont *font)

{
  int iVar1;
  undefined8 in_RSI;
  QFont *in_RDI;
  bool enable;
  bool local_1;
  
  if (*(int *)&(in_RDI->d).d.ptr == 6) {
    iVar1 = QVariant::toInt((bool *)&in_RDI->resolve_mask);
    enable = SUB81((ulong)in_RSI >> 0x38,0);
    if (iVar1 == 1) {
      QFont::setKerning(in_RDI,enable);
      local_1 = true;
    }
    else if (iVar1 == 0x25) {
      local_1 = true;
    }
    else if (iVar1 == 0x27) {
      QFont::setKerning(in_RDI,enable);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool setFontKerningFromValue(const QCss::Value &value, QFont *font)
{
    if (value.type != Value::KnownIdentifier)
        return false ;
    switch (value.variant.toInt()) {
        case Value_Normal: font->setKerning(true); return true;
        case Value_None: font->setKerning(false); return true;
        case Value_Auto: return true;
        default: break;
    }
    return false;
}